

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSet::DropEntryInternal
          (CatalogSet *this,CatalogTransaction transaction,string *name,bool allow_drop_internal)

{
  transaction_t tVar1;
  _Alloc_hider _Var2;
  int iVar3;
  optional_ptr<duckdb::CatalogEntry,_true> oVar4;
  CatalogEntry *pCVar5;
  undefined4 extraout_var;
  pointer pIVar6;
  DuckTransactionManager *this_00;
  Transaction *transaction_p;
  type entry_00;
  CatalogException *this_01;
  allocator local_81;
  _Head_base<0UL,_duckdb::InCatalogEntry_*,_false> local_80;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  oVar4 = GetEntryInternal(this,transaction,name);
  if (oVar4.ptr != (CatalogEntry *)0x0) {
    entry.ptr = oVar4.ptr;
    pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    if (pCVar5->internal == true && !allow_drop_internal) {
      this_01 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_70,
                 "Cannot drop entry \"%s\" because it is an internal system entry",&local_81);
      pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&pCVar5->name);
      CatalogException::CatalogException<std::__cxx11::string>(this_01,&local_70,&local_50);
      __cxa_throw(this_01,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    (*pCVar5->_vptr_CatalogEntry[6])(pCVar5);
    local_81 = (allocator)0x33;
    pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    iVar3 = (*pCVar5->_vptr_CatalogEntry[0xb])(pCVar5);
    pCVar5 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    make_uniq<duckdb::InCatalogEntry,duckdb::CatalogType,duckdb::Catalog&,std::__cxx11::string&>
              ((duckdb *)&local_70,(CatalogType *)&local_81,(Catalog *)CONCAT44(extraout_var,iVar3),
               &pCVar5->name);
    tVar1 = transaction.transaction_id;
    pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_70);
    LOCK();
    (pIVar6->super_CatalogEntry).timestamp.super___atomic_base<unsigned_long>._M_i = tVar1;
    UNLOCK();
    pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_70);
    (pIVar6->super_CatalogEntry).set.ptr = this;
    pIVar6 = unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>::
             operator->((unique_ptr<duckdb::InCatalogEntry,_std::default_delete<duckdb::InCatalogEntry>,_true>
                         *)&local_70);
    _Var2._M_p = local_70._M_dataplus._M_p;
    (pIVar6->super_CatalogEntry).deleted = true;
    local_70._M_dataplus._M_p = (pointer)0x0;
    local_80._M_head_impl = (InCatalogEntry *)_Var2._M_p;
    CatalogEntryMap::UpdateEntry
              (&this->map,
               (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> *)
               &local_80);
    if (local_80._M_head_impl != (InCatalogEntry *)0x0) {
      (*((local_80._M_head_impl)->super_CatalogEntry)._vptr_CatalogEntry[1])();
    }
    local_80._M_head_impl = (InCatalogEntry *)0x0;
    if (transaction.transaction.ptr != (Transaction *)0x0) {
      this_00 = DuckTransactionManager::Get((this->catalog->super_Catalog).db);
      transaction_p = optional_ptr<duckdb::Transaction,_true>::operator*(&transaction.transaction);
      entry_00 = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
                 operator*((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                            *)(_Var2._M_p + 200));
      DuckTransactionManager::PushCatalogEntry(this_00,transaction_p,entry_00,(data_ptr_t)0x0,0);
    }
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
    }
  }
  return oVar4.ptr != (CatalogEntry *)0x0;
}

Assistant:

bool CatalogSet::DropEntryInternal(CatalogTransaction transaction, const string &name, bool allow_drop_internal) {
	// lock the catalog for writing
	// we can only delete an entry that exists
	auto entry = GetEntryInternal(transaction, name);
	if (!entry) {
		return false;
	}
	if (entry->internal && !allow_drop_internal) {
		throw CatalogException("Cannot drop entry \"%s\" because it is an internal system entry", entry->name);
	}

	entry->OnDrop();

	// create a new tombstone entry and replace the currently stored one
	// set the timestamp to the timestamp of the current transaction
	// and point it at the tombstone node
	auto value = make_uniq<InCatalogEntry>(CatalogType::DELETED_ENTRY, entry->ParentCatalog(), entry->name);
	value->timestamp = transaction.transaction_id;
	value->set = this;
	value->deleted = true;
	auto value_ptr = value.get();
	map.UpdateEntry(std::move(value));

	// push the old entry in the undo buffer for this transaction
	if (transaction.transaction) {
		DuckTransactionManager::Get(GetCatalog().GetAttached())
		    .PushCatalogEntry(*transaction.transaction, value_ptr->Child());
	}
	return true;
}